

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

bool __thiscall CHud::IsLargeWarmupTimerShown(CHud *this)

{
  bool bVar1;
  int64 iVar2;
  long lVar3;
  CStats *in_RDI;
  CMotd *in_stack_ffffffffffffffd8;
  bool local_19;
  bool local_9;
  
  bVar1 = CMotd::IsActive(in_stack_ffffffffffffffd8);
  local_9 = false;
  if (!bVar1) {
    bVar1 = CScoreboard::IsActive(((in_RDI->super_CComponent).m_pClient)->m_pScoreboard);
    local_9 = false;
    if (!bVar1) {
      bVar1 = CStats::IsActive(in_RDI);
      local_9 = false;
      if (!bVar1) {
        local_19 = true;
        if (*(long *)(in_RDI->m_aStats[0].m_aFragsWith + 3) != 0) {
          iVar2 = time_get();
          lVar3 = iVar2 - *(long *)(in_RDI->m_aStats[0].m_aFragsWith + 3);
          iVar2 = time_freq();
          local_19 = lVar3 / iVar2 < 10;
        }
        local_9 = local_19;
      }
    }
  }
  return local_9;
}

Assistant:

bool CHud::IsLargeWarmupTimerShown()
{
	return !m_pClient->m_pMotd->IsActive()
		&& !m_pClient->m_pScoreboard->IsActive()
		&& !m_pClient->m_pStats->IsActive()
		&& (m_WarmupHideTick == 0 || (time_get() - m_WarmupHideTick) / time_freq() < 10); // inactivity based
}